

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::featureSpecList(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  bool bVar2;
  int iVar3;
  NoViableAltException *pNVar4;
  RefAST RVar5;
  factory_type *this_01;
  RefAST tmp156_AST;
  ASTPair currentAST;
  RefAST featureSpecList_AST;
  ASTFactory AStack_a8;
  ASTPair local_98;
  RefCount<AST> local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefToken local_70;
  RefToken local_68;
  RefToken local_60;
  RefAST local_58;
  RefAST local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_88.ref = nullAST.ref;
  local_98.root.ref = (Ref *)0x0;
  local_98.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_88.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0xd) {
LAB_00190f8f:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar3 != 0xb) goto LAB_00190fc3;
    featureSpecStruct(this);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    local_38.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_38.ref == (Ref *)0x0) {
      local_38.ref = (Ref *)0x0;
    }
    else {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    ASTFactory::addASTChild(pAVar1,&local_98,&local_38);
    RefCount<AST>::~RefCount(&local_38);
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 != 0xd) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar3 == 0x10) goto LAB_0019120d;
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar3 == 0x11) goto LAB_0019120d;
LAB_00191282:
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar2 = BitSet::member(&_tokenSet_42,iVar3);
      if (!bVar2) {
LAB_001912e6:
        pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
        NoViableAltException::NoViableAltException(pNVar4,&local_48);
        __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      bVar2 = BitSet::member(&_tokenSet_4,iVar3);
      if (!bVar2) goto LAB_001912e6;
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar2 = BitSet::member(&_tokenSet_4,iVar3);
      if (!bVar2) goto LAB_001912e6;
      goto LAB_00191483;
    }
LAB_0019120d:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar3 != 4) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 != 0xb) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
        if (iVar3 != 0x12) goto LAB_00191282;
      }
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_41,iVar3);
    if (!bVar2) goto LAB_00191282;
    featureSpecList(this);
    local_40.ref = this_00->ref;
    if (local_40.ref == (Ref *)0x0) {
      local_40.ref = (Ref *)0x0;
    }
    else {
      (local_40.ref)->count = (local_40.ref)->count + 1;
    }
    ASTFactory::addASTChild(pAVar1,&local_98,&local_40);
    this_01 = (factory_type *)&local_40;
  }
  else {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 0x10) goto LAB_00190f8f;
LAB_00190fc3:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 != 0xd) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar3 != 0x10) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
        if (iVar3 != 0x11) goto LAB_001914cc;
      }
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar3 != 4) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 != 0x12) {
LAB_001914cc:
        pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
        NoViableAltException::NoViableAltException(pNVar4,&local_70);
        __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
    }
    featureSpecFlat(this);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    local_50.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_50.ref == (Ref *)0x0) {
      local_50.ref = (Ref *)0x0;
    }
    else {
      (local_50.ref)->count = (local_50.ref)->count + 1;
    }
    ASTFactory::addASTChild(pAVar1,&local_98,&local_50);
    RefCount<AST>::~RefCount(&local_50);
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 8) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 != 0xd) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
        if (iVar3 != 0x10) {
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
          if (iVar3 != 0x11) goto LAB_00191102;
        }
      }
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      if (iVar3 != 4) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
        if (iVar3 != 0xb) {
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
          if (iVar3 != 0x12) goto LAB_00191102;
        }
      }
      AStack_a8.nodeFactory = (factory_type)nullAST.ref;
      if (nullAST.ref == (Ref *)0x0) {
        AStack_a8.nodeFactory = (factory_type)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
      ASTFactory::create(&AStack_a8,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&AStack_a8.nodeFactory,(RefCount<AST> *)&AStack_a8);
      RefCount<AST>::~RefCount((RefCount<AST> *)&AStack_a8);
      RefCount<Token>::~RefCount(&local_78);
      Parser::match((Parser *)this,8);
      featureSpecList(this);
      local_58.ref = this_00->ref;
      if (local_58.ref == (Ref *)0x0) {
        local_58.ref = (Ref *)0x0;
      }
      else {
        (local_58.ref)->count = (local_58.ref)->count + 1;
      }
      ASTFactory::addASTChild(pAVar1,&local_98,&local_58);
      RefCount<AST>::~RefCount(&local_58);
      RefCount<AST>::~RefCount((RefCount<AST> *)&AStack_a8.nodeFactory);
    }
    else {
LAB_00191102:
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar2 = BitSet::member(&_tokenSet_43,iVar3);
      if (!bVar2) {
LAB_00191166:
        pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
        NoViableAltException::NoViableAltException(pNVar4,&local_60);
        __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      bVar2 = BitSet::member(&_tokenSet_4,iVar3);
      if (!bVar2) goto LAB_00191166;
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar2 = BitSet::member(&_tokenSet_4,iVar3);
      if (!bVar2) goto LAB_00191166;
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar5 = nullAST;
    if ((iVar3 - 0xcU < 6) || (iVar3 - 9U < 2)) goto LAB_00191483;
    if (iVar3 != 8) {
      pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
      NoViableAltException::NoViableAltException(pNVar4,&local_68);
      __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if (nullAST.ref == (Ref *)0x0) {
      RVar5.ref = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    AStack_a8.nodeFactory = (factory_type)RVar5.ref;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    ASTFactory::create(&AStack_a8,(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&AStack_a8.nodeFactory,(RefCount<AST> *)&AStack_a8);
    RefCount<AST>::~RefCount((RefCount<AST> *)&AStack_a8);
    RefCount<Token>::~RefCount(&local_80);
    Parser::match((Parser *)this,8);
    this_01 = &AStack_a8.nodeFactory;
  }
  RefCount<AST>::~RefCount((RefCount<AST> *)this_01);
LAB_00191483:
  RefCount<AST>::operator=(&local_88,&local_98.root);
  RefCount<AST>::operator=(this_00,&local_88);
  RefCount<AST>::~RefCount(&local_88);
  RefCount<AST>::~RefCount(&local_98.child);
  RefCount<AST>::~RefCount(&local_98.root);
  return;
}

Assistant:

void GrpParser::featureSpecList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST featureSpecList_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==IDENT||LA(1)==LITERAL_name) && (LA(2)==OP_LBRACE)) {
			featureSpecStruct();
			astFactory.addASTChild(currentAST, returnAST);
			{
			if ((LA(1)==IDENT||LA(1)==LITERAL_name||LA(1)==LIT_INT) && (LA(2)==OP_EQ||LA(2)==OP_LBRACE||LA(2)==OP_DOT) && (_tokenSet_41.member(LA(3)))) {
				featureSpecList();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else if ((_tokenSet_42.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
		}
		else if ((LA(1)==IDENT||LA(1)==LITERAL_name||LA(1)==LIT_INT) && (LA(2)==OP_EQ||LA(2)==OP_DOT)) {
			featureSpecFlat();
			astFactory.addASTChild(currentAST, returnAST);
			{
			if ((LA(1)==OP_SEMI) && (LA(2)==IDENT||LA(2)==LITERAL_name||LA(2)==LIT_INT) && (LA(3)==OP_EQ||LA(3)==OP_LBRACE||LA(3)==OP_DOT)) {
				RefAST tmp156_AST = nullAST;
				tmp156_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				featureSpecList();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else if ((_tokenSet_43.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
			{
			switch ( LA(1)) {
			case OP_SEMI:
			{
				RefAST tmp157_AST = nullAST;
				tmp157_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				break;
			}
			case LITERAL_environment:
			case LITERAL_endenvironment:
			case OP_RBRACE:
			case IDENT:
			case LITERAL_table:
			case LITERAL_endtable:
			case LITERAL_name:
			case LIT_INT:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		featureSpecList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_42);
	}
	returnAST = featureSpecList_AST;
}